

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::~QComboBox(QComboBox *this)

{
  QComboBoxPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  bool bVar3;
  int in_ESI;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007c9c20;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QComboBox_007c9df0;
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  QComboBoxPrivate::disconnectModel(this_00);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this_00->container);
  if (bVar3) {
    QWidget::close((QWidget *)(this_00->container).wp.value,in_ESI);
    pDVar1 = (this_00->container).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       (pQVar2 = (this_00->container).wp.value, pQVar2 != (QObject *)0x0)) {
      (**(code **)(*(long *)pQVar2 + 0x20))();
    }
    QWeakPointer<QObject>::assign<QObject>(&(this_00->container).wp,(QObject *)0x0);
  }
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QComboBox::~QComboBox()
{
    // ### check delegateparent and delete delegate if us?
    Q_D(QComboBox);

    QT_TRY {
        d->disconnectModel();
    }